

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapCutCost(Ivy_Man_t *pAig,Vec_Ptr_t *vFront)

{
  int iVar1;
  Ivy_Obj_t *pObj;
  Ivy_Supp_t *pIVar2;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Ivy_Obj_t *pFanin;
  Ivy_Supp_t *pSuppF;
  Vec_Ptr_t *vFront_local;
  Ivy_Man_t *pAig_local;
  
  local_30 = 0;
  for (local_2c = 0; iVar1 = Vec_PtrSize(vFront), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(vFront,local_2c);
    pIVar2 = Ivy_ObjSupp(pAig,pObj);
    if (pIVar2->nRefs == 0) {
      local_30 = local_30 + 1;
    }
  }
  return local_30;
}

Assistant:

int Ivy_FastMapCutCost( Ivy_Man_t * pAig, Vec_Ptr_t * vFront )
{
    Ivy_Supp_t * pSuppF;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        pSuppF = Ivy_ObjSupp( pAig, pFanin );
        if ( pSuppF->nRefs == 0 )
            Counter++;
    }
    return Counter;
}